

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::subSatSI16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int32_t iVar4;
  ushort uVar5;
  
  uVar3 = geti32(this);
  iVar4 = geti32(other);
  uVar2 = (ushort)uVar3;
  uVar1 = uVar2 - (ushort)iVar4;
  uVar5 = (short)((uVar3 & 0xffff) >> 0xf) + 0x7fff;
  if (-1 < (short)((uVar2 ^ uVar1) & ((ushort)iVar4 ^ uVar2))) {
    uVar5 = uVar1;
  }
  *(int *)&__return_storage_ptr__->field_0 = (int)(short)uVar5;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::subSatSI16(const Literal& other) const {
  return Literal(sub_sat_s<int16_t>(geti32(), other.geti32()));
}